

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  GCObject *t_00;
  Table *events;
  Value *pVVar1;
  TValue *pTVar2;
  Value *pVVar3;
  TValue *o2_1;
  StkId pTVar4;
  TValue *o2_2;
  TValue *o1;
  int iVar5;
  bool bVar6;
  TValue temp;
  
  iVar5 = 100;
  do {
    bVar6 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar6) {
      luaG_runerror(L,"loop in settable");
      return;
    }
    if (t->tt == 5) {
      t_00 = (t->value).gc;
      pTVar2 = luaH_set(L,&t_00->h,key);
      if ((((pTVar2->tt != 0) || (events = (t_00->h).metatable, events == (Table *)0x0)) ||
          ((events->flags & 2) != 0)) ||
         (pVVar3 = &luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1])->value, pVVar3 == (Value *)0x0)
         ) {
        pTVar2->value = val->value;
        iVar5 = val->tt;
        pTVar2->tt = iVar5;
        (t_00->h).flags = '\0';
        if (iVar5 < 4) {
          return;
        }
        if (((((val->value).gc)->gch).marked & 3) == 0) {
          return;
        }
        if (((t_00->gch).marked & 4) == 0) {
          return;
        }
        luaC_barrierback(L,&t_00->h);
        return;
      }
    }
    else {
      pVVar3 = &luaT_gettmbyobj(L,t,TM_NEWINDEX)->value;
      if (pVVar3[1].b == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    if (pVVar3[1].b == 6) {
      pVVar1 = &L->top->value;
      *pVVar1 = *pVVar3;
      pVVar1[1].b = pVVar3[1].b;
      pTVar4 = L->top;
      pTVar4[1].value = t->value;
      pTVar4[1].tt = t->tt;
      pTVar4 = L->top;
      pTVar4[2].value = key->value;
      pTVar4[2].tt = key->tt;
      pTVar4 = L->top;
      pTVar4[3].value = val->value;
      pTVar4[3].tt = val->tt;
      pTVar4 = L->top;
      if ((long)L->stack_last - (long)pTVar4 < 0x41) {
        luaD_growstack(L,4);
        pTVar4 = L->top;
      }
      L->top = pTVar4 + 4;
      luaD_call(L,pTVar4,0);
      return;
    }
    temp.value = *pVVar3;
    temp.tt = pVVar3[1].b;
    t = &temp;
  } while( true );
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  int loop;
  TValue temp;
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;
    if (ttistable(t)) {  /* `t' is a table? */
      Table *h = hvalue(t);
      TValue *oldval = luaH_set(L, h, key); /* do a primitive set */
      if (!ttisnil(oldval) ||  /* result is no nil? */
          (tm = fasttm(L, h->metatable, TM_NEWINDEX)) == NULL) { /* or no TM? */
        setobj2t(L, oldval, val);
        h->flags = 0;
        luaC_barriert(L, h, val);
        return;
      }
      /* else will try the tag method */
    }
    else if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
      luaG_typeerror(L, t, "index");
    if (ttisfunction(tm)) {
      callTM(L, tm, t, key, val);
      return;
    }
    /* else repeat with `tm' */
    setobj(L, &temp, tm);  /* avoid pointing inside table (may rehash) */
    t = &temp;
  }
  luaG_runerror(L, "loop in settable");
}